

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

void Cut_NodeDoComputeCuts
               (Cut_Man_t *p,Cut_List_t *pSuper,int Node,int fCompl0,int fCompl1,Cut_Cut_t *pList0,
               Cut_Cut_t *pList1,int fTriv,int TreeCode)

{
  uint uVar1;
  int iVar2;
  Cut_Cut_t *pCVar3;
  int Limit;
  int nCutsOld;
  int i;
  Cut_Cut_t *pStore1;
  Cut_Cut_t *pStore0;
  Cut_Cut_t *pTemp1;
  Cut_Cut_t *pTemp0;
  Cut_Cut_t *pStop1;
  Cut_Cut_t *pStop0;
  Cut_Cut_t *pList0_local;
  int fCompl1_local;
  int fCompl0_local;
  int Node_local;
  Cut_List_t *pSuper_local;
  Cut_Man_t *p_local;
  
  pStore1 = (Cut_Cut_t *)0x0;
  _nCutsOld = (Cut_Cut_t *)0x0;
  if (fTriv != 0) {
    pCVar3 = Cut_CutCreateTriv(p,Node);
    Cut_ListAdd(pSuper,pCVar3);
    p->nNodeCuts = p->nNodeCuts + 1;
  }
  if (((pList0 != (Cut_Cut_t *)0x0) && (pList1 != (Cut_Cut_t *)0x0)) &&
     ((p->pParams->fLocal == 0 || (TreeCode == 0)))) {
    uVar1 = p->pParams->nVarsMax;
    p->fSimul = (fCompl0 ^ *(uint *)pList0 >> 0x16 & 1) & (fCompl1 ^ *(uint *)pList1 >> 0x16 & 1);
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    if ((TreeCode & 1U) != 0) {
      if (*(uint *)pList0 >> 0x1c != 1) {
        __assert_fail("pList0->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,600,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      pStore1 = pList0->pNext;
      pList0->pNext = (Cut_Cut_t *)0x0;
    }
    pStop1 = pList0;
    if ((TreeCode & 2U) != 0) {
      if (*(uint *)pList1 >> 0x1c != 1) {
        __assert_fail("pList1->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                      ,0x25e,
                      "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                     );
      }
      _nCutsOld = pList1->pNext;
      pList1->pNext = (Cut_Cut_t *)0x0;
    }
    for (; (pStop1 != (Cut_Cut_t *)0x0 && (*(uint *)pStop1 >> 0x1c != uVar1));
        pStop1 = pStop1->pNext) {
    }
    for (pTemp0 = pList1;
        (pTemp1 = pList0, pTemp0 != (Cut_Cut_t *)0x0 && (*(uint *)pTemp0 >> 0x1c != uVar1));
        pTemp0 = pTemp0->pNext) {
    }
    for (; pCVar3 = pList0, pTemp1 != pStop1; pTemp1 = pTemp1->pNext) {
      for (pStore0 = pList1; pStore0 != pTemp0; pStore0 = pStore0->pNext) {
        iVar2 = Cut_CutProcessTwo(p,pTemp1,pStore0,pSuper);
        if (iVar2 != 0) goto LAB_005b66d5;
      }
    }
    while (pTemp1 = pCVar3, pTemp1 != pStop1) {
      for (pStore0 = pTemp0; pStore0 != (Cut_Cut_t *)0x0; pStore0 = pStore0->pNext) {
        if (((pTemp1->uSign & pStore0->uSign) == pTemp1->uSign) &&
           (iVar2 = Cut_CutProcessTwo(p,pTemp1,pStore0,pSuper), iVar2 != 0)) goto LAB_005b66d5;
      }
      pCVar3 = pTemp1->pNext;
    }
    for (pStore0 = pList1; pStore0 != pTemp0; pStore0 = pStore0->pNext) {
      for (pTemp1 = pStop1; pTemp1 != (Cut_Cut_t *)0x0; pTemp1 = pTemp1->pNext) {
        if (((pTemp1->uSign & pStore0->uSign) == pStore0->uSign) &&
           (iVar2 = Cut_CutProcessTwo(p,pTemp1,pStore0,pSuper), iVar2 != 0)) goto LAB_005b66d5;
      }
    }
    for (pTemp1 = pStop1; pTemp1 != (Cut_Cut_t *)0x0; pTemp1 = pTemp1->pNext) {
      for (pStore0 = pTemp0; pStore0 != (Cut_Cut_t *)0x0; pStore0 = pStore0->pNext) {
        if ((*(uint *)pTemp1 >> 0x1c != uVar1) || (*(uint *)pStore0 >> 0x1c != uVar1)) {
          __assert_fail("pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutNode.c"
                        ,0x287,
                        "void Cut_NodeDoComputeCuts(Cut_Man_t *, Cut_List_t *, int, int, int, Cut_Cut_t *, Cut_Cut_t *, int, int)"
                       );
        }
        if (pTemp1->uSign == pStore0->uSign) {
          Limit = 0;
          while ((Limit < (int)uVar1 &&
                 (*(int *)(&pTemp1[1].field_0x0 + (long)Limit * 4) ==
                  *(int *)(&pStore0[1].field_0x0 + (long)Limit * 4)))) {
            Limit = Limit + 1;
          }
          if (((int)uVar1 <= Limit) &&
             (iVar2 = Cut_CutProcessTwo(p,pTemp1,pStore0,pSuper), iVar2 != 0)) goto LAB_005b66d5;
        }
      }
    }
    if (p->nNodeCuts == 0) {
      p->nNodesNoCuts = p->nNodesNoCuts + 1;
    }
LAB_005b66d5:
    if ((TreeCode & 1U) != 0) {
      pList0->pNext = pStore1;
    }
    if ((TreeCode & 2U) != 0) {
      pList1->pNext = _nCutsOld;
    }
  }
  return;
}

Assistant:

void Cut_NodeDoComputeCuts( Cut_Man_t * p, Cut_List_t * pSuper, int Node, int fCompl0, int fCompl1, Cut_Cut_t * pList0, Cut_Cut_t * pList1, int fTriv, int TreeCode )
{
    Cut_Cut_t * pStop0, * pStop1, * pTemp0, * pTemp1;
    Cut_Cut_t * pStore0 = NULL, * pStore1 = NULL; // Suppress "might be used uninitialized"
    int i, nCutsOld, Limit;
    // start with the elementary cut
    if ( fTriv ) 
    {
//        printf( "Creating trivial cut %d.\n", Node );
        pTemp0 = Cut_CutCreateTriv( p, Node );
        Cut_ListAdd( pSuper, pTemp0 );
        p->nNodeCuts++;
    }
    // get the cut lists of children
    if ( pList0 == NULL || pList1 == NULL || (p->pParams->fLocal && TreeCode)  )
        return;

    // remember the old number of cuts
    nCutsOld = p->nCutsCur;
    Limit = p->pParams->nVarsMax;
    // get the simultation bit of the node
    p->fSimul = (fCompl0 ^ pList0->fSimul) & (fCompl1 ^ pList1->fSimul);
    // set temporary variables
    p->fCompl0 = fCompl0;
    p->fCompl1 = fCompl1;
    // if tree cuts are computed, make sure only the unit cuts propagate over the DAG nodes
    if ( TreeCode & 1 )
    {
        assert( pList0->nLeaves == 1 );
        pStore0 = pList0->pNext;
        pList0->pNext = NULL;
    }
    if ( TreeCode & 2 )
    {
        assert( pList1->nLeaves == 1 );
        pStore1 = pList1->pNext;
        pList1->pNext = NULL;
    }
    // find the point in the list where the max-var cuts begin
    Cut_ListForEachCut( pList0, pStop0 )
        if ( pStop0->nLeaves == (unsigned)Limit )
            break;
    Cut_ListForEachCut( pList1, pStop1 )
        if ( pStop1->nLeaves == (unsigned)Limit )
            break;

    // small by small
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    {
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList0, pTemp0, pStop0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp0->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // small by large
    Cut_ListForEachCutStop( pList1, pTemp1, pStop1 )
    Cut_ListForEachCut( pStop0, pTemp0 )
    {
        if ( (pTemp0->uSign & pTemp1->uSign) != pTemp1->uSign )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    }
    // large by large
    Cut_ListForEachCut( pStop0, pTemp0 )
    Cut_ListForEachCut( pStop1, pTemp1 )
    {
        assert( pTemp0->nLeaves == (unsigned)Limit && pTemp1->nLeaves == (unsigned)Limit );
        if ( pTemp0->uSign != pTemp1->uSign )
            continue;
        for ( i = 0; i < Limit; i++ )
            if ( pTemp0->pLeaves[i] != pTemp1->pLeaves[i] )
                break;
        if ( i < Limit )
            continue;
        if ( Cut_CutProcessTwo( p, pTemp0, pTemp1, pSuper ) )
            goto Quits;
    } 
    if ( p->nNodeCuts == 0 )
        p->nNodesNoCuts++;
Quits:
    if ( TreeCode & 1 )
        pList0->pNext = pStore0;
    if ( TreeCode & 2 )
        pList1->pNext = pStore1;
}